

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DriverProxy.h
# Opt level: O0

int64_t __thiscall
aeron::DriverProxy::addRcvDestination
          (DriverProxy *this,int64_t subscriptionRegistrationId,string *channel)

{
  int64_t iVar1;
  undefined8 *in_RDI;
  int64_t correlationId;
  anon_class_32_4_a7d1d41a *in_stack_000002a8;
  DriverProxy *in_stack_000002b0;
  
  iVar1 = concurrent::ringbuffer::ManyToOneRingBuffer::nextCorrelationId
                    ((ManyToOneRingBuffer *)*in_RDI);
  writeCommandToDriver<aeron::DriverProxy::addRcvDestination(long,std::__cxx11::string_const&)::_lambda(aeron::concurrent::AtomicBuffer&,int&)_1_>
            (in_stack_000002b0,in_stack_000002a8);
  return iVar1;
}

Assistant:

std::int64_t addRcvDestination(std::int64_t subscriptionRegistrationId, const std::string& channel)
    {
        std::int64_t correlationId = m_toDriverCommandBuffer.nextCorrelationId();

        writeCommandToDriver([&](AtomicBuffer &buffer, util::index_t &length)
        {
            DestinationMessageFlyweight addMessage(buffer, 0);

            addMessage.clientId(m_clientId);
            addMessage.registrationId(subscriptionRegistrationId);
            addMessage.correlationId(correlationId);
            addMessage.channel(channel);

            length = addMessage.length();

            return ControlProtocolEvents::ADD_RCV_DESTINATION;
        });

        return correlationId;
    }